

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001766b0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001766b7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001766a0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001766a8 = 0x2d2d2d2d2d2d2d;
    DAT_001766af = 0x2d;
    _DAT_00176690 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000176698 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00176680 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000176688 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000176678 = 0x2d2d2d2d2d2d2d2d;
    DAT_001766bf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }